

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O2

size_t __thiscall GF2::WW<135UL>::Weight(WW<135UL> *this)

{
  size_t sVar1;
  byte bVar2;
  size_t pos;
  ulong uVar3;
  
  bVar2 = 0;
  sVar1 = 0;
  for (uVar3 = 0; uVar3 != 0x11; uVar3 = uVar3 + 1) {
    sVar1 = sVar1 + Weight::_bitsperoctet
                    [*(ulong *)((long)this->_words + (uVar3 & 0xfffffffffffffff8)) >> (bVar2 & 0x38)
                     & 0xff];
    bVar2 = bVar2 + 8;
  }
  return sVar1;
}

Assistant:

size_t Weight() const
	{	
		static unsigned char _bitsperoctet[256] = 
		{
			0,1,1,2,1,2,2,3,1,2,2,3,2,3,3,4,1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,
			1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
			1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
			2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
			1,2,2,3,2,3,3,4,2,3,3,4,3,4,4,5,2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,
			2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
			2,3,3,4,3,4,4,5,3,4,4,5,4,5,5,6,3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,
			3,4,4,5,4,5,5,6,4,5,5,6,5,6,6,7,4,5,5,6,5,6,6,7,5,6,6,7,6,7,7,8,
		};
		size_t weight = 0;
		for (size_t pos = 0; pos < _ocount; pos++)
			weight += _bitsperoctet[GetOctet(pos)];
		return weight;
	}